

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

uint16_t bitset_container_minimum(bitset_container_t *container)

{
  ulong uVar1;
  long lVar2;
  int in_EAX;
  ulong *puVar3;
  long lVar4;
  
  puVar3 = container->words;
  lVar4 = 0;
  while( true ) {
    uVar1 = *puVar3;
    lVar2 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    if (uVar1 != 0) {
      in_EAX = (int)lVar2 + (int)lVar4;
    }
    if (uVar1 != 0) break;
    lVar4 = lVar4 + 0x40;
    puVar3 = puVar3 + 1;
    if (lVar4 == 0x10000) {
      return 0xffff;
    }
  }
  return (uint16_t)in_EAX;
}

Assistant:

uint16_t bitset_container_minimum(const bitset_container_t *container) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = container->words[i];
    if (w != 0) {
      int r = roaring_trailing_zeroes(w);
      return r + i * 64;
    }
  }
  return UINT16_MAX;
}